

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall avro::json::JsonGenerator::escapeCtl(JsonGenerator *this,char c)

{
  byte bVar1;
  size_t in_RCX;
  size_t sVar2;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  byte in_SIL;
  StreamWriter *in_RDI;
  
  StreamWriter::write(in_RDI,0x5c,in_RDX,in_RCX);
  StreamWriter::write(in_RDI,0x55,__buf,in_RCX);
  StreamWriter::write(in_RDI,0x30,__buf_00,in_RCX);
  StreamWriter::write(in_RDI,0x30,__buf_01,in_RCX);
  sVar2 = 0x10;
  bVar1 = toHex(in_SIL / 0x10);
  StreamWriter::write(in_RDI,(uint)bVar1,__buf_02,sVar2);
  sVar2 = 0x10;
  bVar1 = toHex((uint)in_SIL % 0x10);
  StreamWriter::write(in_RDI,(uint)bVar1,__buf_03,sVar2);
  return;
}

Assistant:

void escapeCtl(char c) {
        out_.write('\\');
        out_.write('U');
        out_.write('0');
        out_.write('0');
        out_.write(toHex((static_cast<unsigned char>(c)) / 16));
        out_.write(toHex((static_cast<unsigned char>(c)) % 16));
    }